

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_wal_autocheckpoint(sqlite3 *db,int nFrame)

{
  int in_ESI;
  _func_int_void_ptr_sqlite3_ptr_char_ptr_int *in_RDI;
  sqlite3 *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI < 1) {
    sqlite3_wal_hook(unaff_retaddr,in_RDI,(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  else {
    sqlite3_wal_hook(unaff_retaddr,in_RDI,(void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_wal_autocheckpoint(sqlite3 *db, int nFrame){
#ifdef SQLITE_OMIT_WAL
  UNUSED_PARAMETER(db);
  UNUSED_PARAMETER(nFrame);
#else
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  if( nFrame>0 ){
    sqlite3_wal_hook(db, sqlite3WalDefaultHook, SQLITE_INT_TO_PTR(nFrame));
  }else{
    sqlite3_wal_hook(db, 0, 0);
  }
#endif
  return SQLITE_OK;
}